

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O0

void __thiscall Parse::SMTLIB2::colorSymbol(SMTLIB2 *this,string *name,Color color)

{
  bool bVar1;
  undefined8 uVar2;
  SMTLIB2 *this_00;
  string *in_RSI;
  Symbol *in_RDI;
  Symbol *sym;
  DeclaredSymbol *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  UserErrorException *in_stack_fffffffffffffeb0;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb8;
  DeclaredSymbol *s_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_fffffffffffffec8;
  Color color_00;
  DeclaredSymbol in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  undefined1 in_stack_ffffffffffffff17;
  Expression *in_stack_ffffffffffffff18;
  
  Lib::
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::find(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  color_00 = (Color)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  bVar1 = Lib::Option::operator_cast_to_bool
                    ((Option<std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>_&> *)0xa53d31);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this_01 = (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>,_Lib::DefaultHash,_Lib::DefaultHash2>
               *)&in_RDI[1]._type;
    s_00 = (DeclaredSymbol *)&stack0xfffffffffffffee0;
    std::__cxx11::string::string((string *)s_00,in_RSI);
    this_00 = (SMTLIB2 *)
              Lib::
              DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>,_Lib::DefaultHash,_Lib::DefaultHash2>
              ::get(this_01,in_stack_fffffffffffffea8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
    DAT_01333880 = 1;
    getSymbol(this_00,s_00);
    Kernel::Signature::Symbol::addColor(in_RDI,color_00);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x50);
  std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  std::operator+(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
  std::operator+(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
  Shell::LispParser::Expression::toString_abi_cxx11_
            (in_stack_ffffffffffffff18,(bool)in_stack_ffffffffffffff17);
  std::operator+(in_stack_fffffffffffffee8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffee0);
  std::operator+(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0);
  Lib::UserErrorException::Exception(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  __cxa_throw(uVar2,&Lib::UserErrorException::typeinfo,Lib::UserErrorException::~UserErrorException)
  ;
}

Assistant:

void SMTLIB2::colorSymbol(const std::string& name, Color color)
{
  if (!_declaredSymbols.find(name)) {
    USER_ERROR_EXPR("'"+name+"' is not a user symbol");
  }
  DeclaredSymbol& s = _declaredSymbols.get(name);

  env.colorUsed = true;

  Signature::Symbol* sym = getSymbol(s);
  sym->addColor(color);
}